

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  long lVar7;
  long *plVar8;
  BYTE *pBVar9;
  undefined8 uVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  byte bVar15;
  U32 UVar16;
  long *plVar17;
  long lVar18;
  ulong uVar19;
  long *iend;
  int iVar20;
  U32 UVar21;
  int *piVar22;
  int *piVar23;
  seqDef *psVar24;
  uint uVar25;
  long *plVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long *plVar34;
  uint uVar35;
  int iVar36;
  uint local_b8;
  U32 local_b4;
  ulong local_a8;
  BYTE *litLimit_w;
  
  pBVar5 = (ms->window).base;
  pInLimit = (BYTE *)((long)src + srcSize);
  iVar36 = (int)pBVar5;
  iVar20 = (int)pInLimit - iVar36;
  uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar12 = (ms->window).dictLimit;
  uVar13 = iVar20 - uVar28;
  if (iVar20 - uVar12 <= uVar28) {
    uVar13 = uVar12;
  }
  if (ms->loadedDictEnd != 0) {
    uVar13 = uVar12;
  }
  piVar22 = (int *)(pBVar5 + uVar13);
  plVar34 = (long *)((ulong)(piVar22 == (int *)src) + (long)src);
  iVar20 = (int)plVar34 - iVar36;
  uVar35 = iVar20 - uVar28;
  if (iVar20 - uVar12 <= uVar28) {
    uVar35 = uVar12;
  }
  if (ms->loadedDictEnd != 0) {
    uVar35 = uVar12;
  }
  uVar12 = (ms->cParams).targetLength;
  uVar30 = (ulong)(uVar12 + 1 + (uint)(uVar12 == 0));
  uVar35 = iVar20 - uVar35;
  uVar12 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  plVar26 = (long *)((long)src + (srcSize - 8));
  uVar28 = rep[1];
  local_b8 = uVar28;
  if (uVar35 < uVar28) {
    local_b8 = 0;
  }
  uVar3 = *rep;
  uVar25 = 0;
  if (uVar3 <= uVar35) {
    uVar25 = uVar3;
  }
  local_a8 = (ulong)uVar25;
  iend = (long *)((long)src + (ulong)(piVar22 == (int *)src) + 1);
  cVar11 = (char)(ms->cParams).hashLog;
  if (uVar12 == 5) {
    bVar15 = 0x40 - cVar11;
    plVar17 = (long *)(pInLimit + -0x20);
    do {
      uVar12 = (uint)local_a8;
      lVar27 = -local_a8;
      while( true ) {
        if (plVar26 <= iend) goto LAB_001af92d;
        lVar18 = *plVar34;
        uVar31 = (ulong)(lVar18 * -0x30e4432345000000) >> (bVar15 & 0x3f);
        lVar7 = *iend;
        uVar33 = (ulong)(lVar7 * -0x30e4432345000000) >> (bVar15 & 0x3f);
        iVar20 = (int)iend;
        uVar25 = pUVar6[uVar31];
        uVar4 = pUVar6[uVar33];
        UVar21 = (U32)((long)plVar34 - (long)pBVar5);
        pUVar6[uVar31] = UVar21;
        pUVar6[uVar33] = iVar20 - iVar36;
        if ((uVar12 != 0) && (*(int *)((long)plVar34 + lVar27 + 2) == *(int *)((long)plVar34 + 2)))
        {
          uVar31 = (ulong)(*(char *)((long)plVar34 + 1) == *(char *)((long)plVar34 + lVar27 + 1));
          iend = (long *)((long)plVar34 + (2 - uVar31));
          piVar23 = (int *)(lVar27 + (long)iend);
          uVar31 = uVar31 | 4;
          local_b4 = 1;
          goto LAB_001af322;
        }
        if ((uVar13 < uVar25) && (piVar23 = (int *)(pBVar5 + uVar25), *piVar23 == (int)lVar18))
        break;
        if ((uVar13 < uVar4) && (piVar23 = (int *)(pBVar5 + uVar4), *piVar23 == (int)lVar7))
        goto LAB_001af2e4;
        lVar18 = ((ulong)((long)plVar34 - (long)src) >> 7) + uVar30;
        plVar34 = (long *)((long)plVar34 + lVar18);
        iend = (long *)((long)iend + lVar18);
      }
      iVar20 = (int)plVar34;
      iend = plVar34;
LAB_001af2e4:
      uVar25 = iVar20 - (int)piVar23;
      local_a8 = (ulong)uVar25;
      uVar31 = 4;
      for (; ((piVar22 < piVar23 && (src < iend)) &&
             (*(char *)((long)iend + -1) == *(char *)((long)piVar23 + -1)));
          iend = (long *)((long)iend + -1)) {
        piVar23 = (int *)((long)piVar23 + -1);
        uVar31 = uVar31 + 1;
      }
      local_b4 = uVar25 + 3;
      local_b8 = uVar12;
LAB_001af322:
      sVar14 = ZSTD_count((BYTE *)((long)iend + uVar31),(BYTE *)((long)piVar23 + uVar31),pInLimit);
      uVar33 = (long)iend - (long)src;
      plVar8 = (long *)seqStore->lit;
      if (plVar17 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar8,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar17);
LAB_001af365:
        seqStore->lit = seqStore->lit + uVar33;
        psVar24 = seqStore->sequences;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = *(long *)((long)src + 8);
        *plVar8 = *src;
        plVar8[1] = lVar27;
        pBVar9 = seqStore->lit;
        if (0x10 < uVar33) {
          lVar27 = *(long *)((long)src + 0x18);
          *(long *)(pBVar9 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar9 + 0x18) = lVar27;
          if (0x20 < (long)uVar33) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
              uVar10 = puVar2[1];
              pBVar1 = pBVar9 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar2;
              *(undefined8 *)(pBVar1 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar1 + 0x18) = uVar10;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar9 + uVar33);
          }
          goto LAB_001af365;
        }
        seqStore->lit = pBVar9 + uVar33;
        psVar24 = seqStore->sequences;
      }
      uVar19 = (sVar14 + uVar31) - 3;
      psVar24->litLength = (U16)uVar33;
      psVar24->offset = local_b4;
      if (0xffff < uVar19) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar24->matchLength = (U16)uVar19;
      seqStore->sequences = psVar24 + 1;
      src = (void *)((long)iend + sVar14 + uVar31);
      if (src <= plVar26) {
        pUVar6[(ulong)(*(long *)(pBVar5 + ((long)plVar34 - (long)pBVar5 & 0xffffffffU) + 2) *
                      -0x30e4432345000000) >> (bVar15 & 0x3f)] = UVar21 + 2;
        pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar15 & 0x3f)] =
             ((int)src + -2) - iVar36;
        if (local_b8 == 0) {
          local_b8 = 0;
        }
        else {
          for (; (src <= plVar26 && ((int)*src == *(int *)((long)src - (ulong)local_b8)));
              src = (void *)((long)src + sVar14 + 4)) {
            sVar14 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b8)),
                                pInLimit);
            pUVar6[(ulong)(*src * -0x30e4432345000000) >> (bVar15 & 0x3f)] = (int)src - iVar36;
            plVar34 = (long *)seqStore->lit;
            if (plVar17 < src) {
              ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)src,(BYTE *)src,(BYTE *)plVar17);
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar34 = *src;
              plVar34[1] = lVar27;
            }
            psVar24 = seqStore->sequences;
            psVar24->litLength = 0;
            psVar24->offset = 1;
            if (0xffff < sVar14 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->matchLength = (U16)(sVar14 + 1);
            seqStore->sequences = psVar24 + 1;
            uVar12 = (uint)local_a8;
            local_a8 = (ulong)local_b8;
            local_b8 = uVar12;
          }
        }
      }
      iend = (long *)((long)src + 1);
      plVar34 = (long *)src;
    } while( true );
  }
  if (uVar12 == 6) {
    bVar15 = 0x40 - cVar11;
    plVar17 = (long *)(pInLimit + -0x20);
    do {
      uVar12 = (uint)local_a8;
      lVar27 = -local_a8;
      while( true ) {
        if (plVar26 <= iend) goto LAB_001af92d;
        lVar18 = *plVar34;
        uVar31 = (ulong)(lVar18 * -0x30e4432340650000) >> (bVar15 & 0x3f);
        lVar7 = *iend;
        uVar33 = (ulong)(lVar7 * -0x30e4432340650000) >> (bVar15 & 0x3f);
        iVar20 = (int)iend;
        uVar25 = pUVar6[uVar31];
        uVar4 = pUVar6[uVar33];
        UVar21 = (U32)((long)plVar34 - (long)pBVar5);
        pUVar6[uVar31] = UVar21;
        pUVar6[uVar33] = iVar20 - iVar36;
        if ((uVar12 != 0) && (*(int *)((long)plVar34 + lVar27 + 2) == *(int *)((long)plVar34 + 2)))
        {
          uVar31 = (ulong)(*(char *)((long)plVar34 + 1) == *(char *)((long)plVar34 + lVar27 + 1));
          iend = (long *)((long)plVar34 + (2 - uVar31));
          piVar23 = (int *)(lVar27 + (long)iend);
          uVar31 = uVar31 | 4;
          local_b4 = 1;
          goto LAB_001aef71;
        }
        if ((uVar13 < uVar25) && (piVar23 = (int *)(pBVar5 + uVar25), *piVar23 == (int)lVar18))
        break;
        if ((uVar13 < uVar4) && (piVar23 = (int *)(pBVar5 + uVar4), *piVar23 == (int)lVar7))
        goto LAB_001aef33;
        lVar18 = ((ulong)((long)plVar34 - (long)src) >> 7) + uVar30;
        plVar34 = (long *)((long)plVar34 + lVar18);
        iend = (long *)((long)iend + lVar18);
      }
      iVar20 = (int)plVar34;
      iend = plVar34;
LAB_001aef33:
      uVar25 = iVar20 - (int)piVar23;
      local_a8 = (ulong)uVar25;
      uVar31 = 4;
      for (; ((piVar22 < piVar23 && (src < iend)) &&
             (*(char *)((long)iend + -1) == *(char *)((long)piVar23 + -1)));
          iend = (long *)((long)iend + -1)) {
        piVar23 = (int *)((long)piVar23 + -1);
        uVar31 = uVar31 + 1;
      }
      local_b4 = uVar25 + 3;
      local_b8 = uVar12;
LAB_001aef71:
      sVar14 = ZSTD_count((BYTE *)((long)iend + uVar31),(BYTE *)((long)piVar23 + uVar31),pInLimit);
      uVar33 = (long)iend - (long)src;
      plVar8 = (long *)seqStore->lit;
      if (plVar17 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar8,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar17);
LAB_001aefb4:
        seqStore->lit = seqStore->lit + uVar33;
        psVar24 = seqStore->sequences;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = *(long *)((long)src + 8);
        *plVar8 = *src;
        plVar8[1] = lVar27;
        pBVar9 = seqStore->lit;
        if (0x10 < uVar33) {
          lVar27 = *(long *)((long)src + 0x18);
          *(long *)(pBVar9 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar9 + 0x18) = lVar27;
          if (0x20 < (long)uVar33) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
              uVar10 = puVar2[1];
              pBVar1 = pBVar9 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar2;
              *(undefined8 *)(pBVar1 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar1 + 0x18) = uVar10;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar9 + uVar33);
          }
          goto LAB_001aefb4;
        }
        seqStore->lit = pBVar9 + uVar33;
        psVar24 = seqStore->sequences;
      }
      uVar19 = (sVar14 + uVar31) - 3;
      psVar24->litLength = (U16)uVar33;
      psVar24->offset = local_b4;
      if (0xffff < uVar19) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar24->matchLength = (U16)uVar19;
      seqStore->sequences = psVar24 + 1;
      src = (void *)((long)iend + sVar14 + uVar31);
      if (src <= plVar26) {
        pUVar6[(ulong)(*(long *)(pBVar5 + ((long)plVar34 - (long)pBVar5 & 0xffffffffU) + 2) *
                      -0x30e4432340650000) >> (bVar15 & 0x3f)] = UVar21 + 2;
        pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar15 & 0x3f)] =
             ((int)src + -2) - iVar36;
        if (local_b8 == 0) {
          local_b8 = 0;
        }
        else {
          for (; (src <= plVar26 && ((int)*src == *(int *)((long)src - (ulong)local_b8)));
              src = (void *)((long)src + sVar14 + 4)) {
            sVar14 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b8)),
                                pInLimit);
            pUVar6[(ulong)(*src * -0x30e4432340650000) >> (bVar15 & 0x3f)] = (int)src - iVar36;
            plVar34 = (long *)seqStore->lit;
            if (plVar17 < src) {
              ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)src,(BYTE *)src,(BYTE *)plVar17);
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar34 = *src;
              plVar34[1] = lVar27;
            }
            psVar24 = seqStore->sequences;
            psVar24->litLength = 0;
            psVar24->offset = 1;
            if (0xffff < sVar14 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->matchLength = (U16)(sVar14 + 1);
            seqStore->sequences = psVar24 + 1;
            uVar12 = (uint)local_a8;
            local_a8 = (ulong)local_b8;
            local_b8 = uVar12;
          }
        }
      }
      iend = (long *)((long)src + 1);
      plVar34 = (long *)src;
    } while( true );
  }
  if (uVar12 != 7) {
    bVar15 = 0x20 - cVar11;
    plVar17 = (long *)(pInLimit + -0x20);
    do {
      uVar12 = (uint)local_a8;
      lVar27 = -local_a8;
      while( true ) {
        if (plVar26 <= iend) goto LAB_001af92d;
        lVar18 = *plVar34;
        uVar29 = (uint)((int)lVar18 * -0x61c8864f) >> (bVar15 & 0x1f);
        lVar7 = *iend;
        uVar32 = (uint)((int)lVar7 * -0x61c8864f) >> (bVar15 & 0x1f);
        iVar20 = (int)iend;
        uVar25 = pUVar6[uVar29];
        uVar4 = pUVar6[uVar32];
        UVar21 = (U32)((long)plVar34 - (long)pBVar5);
        pUVar6[uVar29] = UVar21;
        pUVar6[uVar32] = iVar20 - iVar36;
        if ((uVar12 != 0) && (*(int *)((long)plVar34 + lVar27 + 2) == *(int *)((long)plVar34 + 2)))
        {
          uVar31 = (ulong)(*(char *)((long)plVar34 + 1) == *(char *)((long)plVar34 + lVar27 + 1));
          iend = (long *)((long)plVar34 + (2 - uVar31));
          piVar23 = (int *)(lVar27 + (long)iend);
          uVar31 = uVar31 | 4;
          UVar16 = 1;
          goto LAB_001af6c8;
        }
        if ((uVar13 < uVar25) && (piVar23 = (int *)(pBVar5 + uVar25), *piVar23 == (int)lVar18))
        break;
        if ((uVar13 < uVar4) && (piVar23 = (int *)(pBVar5 + uVar4), *piVar23 == (int)lVar7))
        goto LAB_001af692;
        lVar18 = ((ulong)((long)plVar34 - (long)src) >> 7) + uVar30;
        plVar34 = (long *)((long)plVar34 + lVar18);
        iend = (long *)((long)iend + lVar18);
      }
      iVar20 = (int)plVar34;
      iend = plVar34;
LAB_001af692:
      uVar25 = iVar20 - (int)piVar23;
      local_a8 = (ulong)uVar25;
      uVar31 = 4;
      for (; ((piVar22 < piVar23 && (src < iend)) &&
             (*(char *)((long)iend + -1) == *(char *)((long)piVar23 + -1)));
          iend = (long *)((long)iend + -1)) {
        piVar23 = (int *)((long)piVar23 + -1);
        uVar31 = uVar31 + 1;
      }
      UVar16 = uVar25 + 3;
      local_b8 = uVar12;
LAB_001af6c8:
      sVar14 = ZSTD_count((BYTE *)((long)iend + uVar31),(BYTE *)((long)piVar23 + uVar31),pInLimit);
      uVar33 = (long)iend - (long)src;
      plVar8 = (long *)seqStore->lit;
      if (plVar17 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar8,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar17);
LAB_001af70d:
        seqStore->lit = seqStore->lit + uVar33;
        psVar24 = seqStore->sequences;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = *(long *)((long)src + 8);
        *plVar8 = *src;
        plVar8[1] = lVar27;
        pBVar9 = seqStore->lit;
        if (0x10 < uVar33) {
          lVar27 = *(long *)((long)src + 0x18);
          *(long *)(pBVar9 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar9 + 0x18) = lVar27;
          if (0x20 < (long)uVar33) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
              uVar10 = puVar2[1];
              pBVar1 = pBVar9 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar2;
              *(undefined8 *)(pBVar1 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar1 + 0x18) = uVar10;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar9 + uVar33);
          }
          goto LAB_001af70d;
        }
        seqStore->lit = pBVar9 + uVar33;
        psVar24 = seqStore->sequences;
      }
      uVar19 = (sVar14 + uVar31) - 3;
      psVar24->litLength = (U16)uVar33;
      psVar24->offset = UVar16;
      if (0xffff < uVar19) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar24->matchLength = (U16)uVar19;
      seqStore->sequences = psVar24 + 1;
      src = (void *)((long)iend + sVar14 + uVar31);
      if (src <= plVar26) {
        pUVar6[(uint)(*(int *)(pBVar5 + ((long)plVar34 - (long)pBVar5 & 0xffffffffU) + 2) *
                     -0x61c8864f) >> (bVar15 & 0x1f)] = UVar21 + 2;
        pUVar6[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar15 & 0x1f)] =
             ((int)src + -2) - iVar36;
        if (local_b8 == 0) {
          local_b8 = 0;
        }
        else {
          for (; (src <= plVar26 &&
                 (lVar27 = *src, (int)lVar27 == *(int *)((long)src - (ulong)local_b8)));
              src = (void *)((long)src + sVar14 + 4)) {
            sVar14 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b8)),
                                pInLimit);
            pUVar6[(uint)((int)lVar27 * -0x61c8864f) >> (bVar15 & 0x1f)] = (int)src - iVar36;
            plVar34 = (long *)seqStore->lit;
            if (plVar17 < src) {
              ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)src,(BYTE *)src,(BYTE *)plVar17);
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar34 = *src;
              plVar34[1] = lVar27;
            }
            psVar24 = seqStore->sequences;
            psVar24->litLength = 0;
            psVar24->offset = 1;
            if (0xffff < sVar14 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->matchLength = (U16)(sVar14 + 1);
            seqStore->sequences = psVar24 + 1;
            uVar12 = (uint)local_a8;
            local_a8 = (ulong)local_b8;
            local_b8 = uVar12;
          }
        }
      }
      iend = (long *)((long)src + 1);
      plVar34 = (long *)src;
    } while( true );
  }
  bVar15 = 0x40 - cVar11;
  plVar17 = (long *)(pInLimit + -0x20);
  do {
    uVar12 = (uint)local_a8;
    lVar27 = -local_a8;
LAB_001aeaa8:
    if (plVar26 <= iend) {
LAB_001af92d:
      uVar12 = 0;
      if (uVar35 < uVar28) {
        uVar12 = uVar28;
      }
      if (uVar35 < uVar3) {
        uVar12 = uVar3;
      }
      uVar13 = (uint)local_a8;
      if ((uint)local_a8 == 0) {
        uVar13 = uVar12;
      }
      if (local_b8 != 0) {
        uVar12 = local_b8;
      }
      *rep = uVar13;
      rep[1] = uVar12;
      return (long)pInLimit - (long)src;
    }
    lVar18 = *plVar34;
    uVar31 = (ulong)(lVar18 * -0x30e44323405a9d00) >> (bVar15 & 0x3f);
    lVar7 = *iend;
    uVar33 = (ulong)(lVar7 * -0x30e44323405a9d00) >> (bVar15 & 0x3f);
    iVar20 = (int)iend;
    uVar25 = pUVar6[uVar31];
    uVar4 = pUVar6[uVar33];
    UVar21 = (U32)((long)plVar34 - (long)pBVar5);
    pUVar6[uVar31] = UVar21;
    pUVar6[uVar33] = iVar20 - iVar36;
    if ((uVar12 != 0) && (*(int *)((long)plVar34 + lVar27 + 2) == *(int *)((long)plVar34 + 2))) {
      uVar31 = (ulong)(*(char *)((long)plVar34 + 1) == *(char *)((long)plVar34 + lVar27 + 1));
      iend = (long *)((long)plVar34 + (2 - uVar31));
      piVar23 = (int *)(lVar27 + (long)iend);
      uVar31 = uVar31 | 4;
      local_b4 = 1;
      goto LAB_001aebbc;
    }
    if ((uVar25 <= uVar13) || (piVar23 = (int *)(pBVar5 + uVar25), *piVar23 != (int)lVar18)) {
      if ((uVar13 < uVar4) && (piVar23 = (int *)(pBVar5 + uVar4), *piVar23 == (int)lVar7))
      goto LAB_001aeb7e;
      lVar18 = ((ulong)((long)plVar34 - (long)src) >> 7) + uVar30;
      plVar34 = (long *)((long)plVar34 + lVar18);
      iend = (long *)((long)iend + lVar18);
      goto LAB_001aeaa8;
    }
    iVar20 = (int)plVar34;
    iend = plVar34;
LAB_001aeb7e:
    uVar25 = iVar20 - (int)piVar23;
    local_a8 = (ulong)uVar25;
    uVar31 = 4;
    for (; ((piVar22 < piVar23 && (src < iend)) &&
           (*(char *)((long)iend + -1) == *(char *)((long)piVar23 + -1)));
        iend = (long *)((long)iend + -1)) {
      piVar23 = (int *)((long)piVar23 + -1);
      uVar31 = uVar31 + 1;
    }
    local_b4 = uVar25 + 3;
    local_b8 = uVar12;
LAB_001aebbc:
    sVar14 = ZSTD_count((BYTE *)((long)iend + uVar31),(BYTE *)((long)piVar23 + uVar31),pInLimit);
    uVar33 = (long)iend - (long)src;
    plVar8 = (long *)seqStore->lit;
    if (plVar17 < iend) {
      ZSTD_safecopyLiterals((BYTE *)plVar8,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar17);
LAB_001aebff:
      seqStore->lit = seqStore->lit + uVar33;
      psVar24 = seqStore->sequences;
      if (0xffff < uVar33) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      lVar27 = *(long *)((long)src + 8);
      *plVar8 = *src;
      plVar8[1] = lVar27;
      pBVar9 = seqStore->lit;
      if (0x10 < uVar33) {
        lVar27 = *(long *)((long)src + 0x18);
        *(long *)(pBVar9 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar9 + 0x18) = lVar27;
        if (0x20 < (long)uVar33) {
          lVar27 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
            uVar10 = puVar2[1];
            pBVar1 = pBVar9 + lVar27 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar10;
            puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
            uVar10 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar10;
            lVar27 = lVar27 + 0x20;
          } while (pBVar1 + 0x20 < pBVar9 + uVar33);
        }
        goto LAB_001aebff;
      }
      seqStore->lit = pBVar9 + uVar33;
      psVar24 = seqStore->sequences;
    }
    uVar19 = (sVar14 + uVar31) - 3;
    psVar24->litLength = (U16)uVar33;
    psVar24->offset = local_b4;
    if (0xffff < uVar19) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->matchLength = (U16)uVar19;
    seqStore->sequences = psVar24 + 1;
    src = (void *)((long)iend + sVar14 + uVar31);
    if (src <= plVar26) {
      pUVar6[(ulong)(*(long *)(pBVar5 + ((long)plVar34 - (long)pBVar5 & 0xffffffffU) + 2) *
                    -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = UVar21 + 2;
      pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] =
           ((int)src + -2) - iVar36;
      if (local_b8 == 0) {
        local_b8 = 0;
      }
      else {
        for (; (src <= plVar26 && ((int)*src == *(int *)((long)src - (ulong)local_b8)));
            src = (void *)((long)src + sVar14 + 4)) {
          sVar14 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b8)),
                              pInLimit);
          pUVar6[(ulong)(*src * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = (int)src - iVar36;
          plVar34 = (long *)seqStore->lit;
          if (plVar17 < src) {
            ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)src,(BYTE *)src,(BYTE *)plVar17);
          }
          else {
            lVar27 = *(long *)((long)src + 8);
            *plVar34 = *src;
            plVar34[1] = lVar27;
          }
          psVar24 = seqStore->sequences;
          psVar24->litLength = 0;
          psVar24->offset = 1;
          if (0xffff < sVar14 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar24->matchLength = (U16)(sVar14 + 1);
          seqStore->sequences = psVar24 + 1;
          uVar12 = (uint)local_a8;
          local_a8 = (ulong)local_b8;
          local_b8 = uVar12;
        }
      }
    }
    iend = (long *)((long)src + 1);
    plVar34 = (long *)src;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}